

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall LogFile::write_file(LogFile *this)

{
  pthread_mutex_t *__mutex;
  int __fd;
  _Map_pointer pppcVar1;
  _Elt_pointer ppcVar2;
  char *__s;
  size_t __n;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  __mutex = &this->get_Mutex;
  do {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while( true ) {
      pppcVar1 = (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
      uVar3 = (ulong)((long)pppcVar1 -
                     (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
      lVar4 = (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur -
              (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first >> 3;
      ppcVar2 = (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar5 = (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last - (long)ppcVar2 >> 3;
      if (((uVar3 - 1) + (ulong)(pppcVar1 == (_Map_pointer)0x0)) * 0x40 + lVar4 + lVar5 != 0) break;
      pthread_cond_broadcast((pthread_cond_t *)&this->Swap_Cond);
      pthread_cond_wait((pthread_cond_t *)&this->get_Cond,(pthread_mutex_t *)__mutex);
    }
    lVar5 = ((uVar3 - 1) + (ulong)(pppcVar1 == (_Map_pointer)0x0)) * 0x40 + lVar4 + lVar5;
    while (lVar5 != 0) {
      __s = *ppcVar2;
      std::deque<char_*,_std::allocator<char_*>_>::pop_front
                ((deque<char_*,_std::allocator<char_*>_> *)this);
      __fd = this->fd;
      __n = strlen(__s);
      write(__fd,__s,__n);
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
      pppcVar1 = (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
      ppcVar2 = (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar5 = ((long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last - (long)ppcVar2 >> 3) +
              ((long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur -
               (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)pppcVar1 -
                        (long)(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(pppcVar1 == (_Map_pointer)0x0)) * 0x40;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void LogFile::write_file()
{
    while(true)
    {
        pthread_mutex_lock(&get_Mutex);
        while(WriteTask.size() == 0)
        {
            pthread_cond_broadcast(&Swap_Cond);
            pthread_cond_wait(&get_Cond,&get_Mutex);
        }
        while(WriteTask.size() > 0)
        {
            char* buff = WriteTask.front();
            WriteTask.pop();
            //写日志文件
            write(fd,(void*)buff,strlen(buff));
            //cout<<"Write LogFile Success!"<<endl;
            delete[] buff;
        }
        pthread_mutex_unlock(&get_Mutex);
    }
}